

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void __thiscall
QDockAreaLayout::paintSeparators
          (QDockAreaLayout *this,QPainter *p,QWidget *widget,QRegion *clip,QPoint *mouse)

{
  long lVar1;
  bool bVar2;
  undefined4 uVar3;
  ulong uVar4;
  QPoint *in_RCX;
  QRect *in_RDX;
  QDockAreaLayout *in_RSI;
  QPainter *in_RDI;
  bool in_R8B;
  long in_FS_OFFSET;
  QRect QVar5;
  Orientation opposite;
  QDockAreaLayoutInfo *dock;
  int i;
  QRect r;
  undefined4 in_stack_ffffffffffffff98;
  QPainter *pQVar6;
  QPainter *p_00;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int local_44;
  QRect *pQVar7;
  QDockAreaLayout *pQVar8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = in_RDI;
  for (local_44 = 0; local_44 < 4; local_44 = local_44 + 1) {
    p_00 = pQVar6;
    bVar2 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x57c24f);
    if (!bVar2) {
      QVar5 = separatorRect(in_RSI,(int)((ulong)in_RDX >> 0x20));
      uVar4 = QRegion::contains((QRect *)in_RCX);
      if (((uVar4 & 1) != 0) &&
         (bVar2 = QDockAreaLayoutInfo::hasFixedSize
                            ((QDockAreaLayoutInfo *)
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)), !bVar2)
         ) {
        uVar3 = 1;
        if (*(int *)(pQVar6 + (long)local_44 * 0x70 + 100) == 1) {
          uVar3 = 2;
        }
        in_stack_ffffffffffffffac = uVar3;
        pQVar7 = in_RDX;
        pQVar8 = in_RSI;
        QRect::contains((QPoint *)&stack0xffffffffffffffe8,in_R8B);
        paintSep(p_00,(QWidget *)CONCAT44(uVar3,in_stack_ffffffffffffff98),in_RDX,
                 (Orientation)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
        in_RDX = pQVar7;
        in_RSI = pQVar8;
      }
      uVar4 = QRegion::contains((QRect *)in_RCX);
      if ((uVar4 & 1) != 0) {
        QDockAreaLayoutInfo::paintSeparators
                  (QVar5._0_8_,in_RDI,(QWidget *)in_RSI,(QRegion *)in_RDX,in_RCX);
      }
    }
    pQVar6 = p_00;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockAreaLayout::paintSeparators(QPainter *p, QWidget *widget,
                                                const QRegion &clip,
                                                const QPoint &mouse) const
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &dock = docks[i];
        if (dock.isEmpty())
            continue;
        QRect r = separatorRect(i);
        if (clip.contains(r) && !dock.hasFixedSize()) {
            Qt::Orientation opposite = dock.o == Qt::Horizontal
                                        ? Qt::Vertical : Qt::Horizontal;
            paintSep(p, widget, r, opposite, r.contains(mouse));
        }
        if (clip.contains(dock.rect))
            dock.paintSeparators(p, widget, clip, mouse);
    }
}